

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

void __thiscall
lf::fe::FeHierarchicQuad<double>::FeHierarchicQuad
          (FeHierarchicQuad<double> *this,uint interior_degree,array<unsigned_int,_4UL> edge_degrees
          ,QuadRuleCache *qr_cache,
          span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient)

{
  initializer_list<unsigned_int> __l;
  QuadRuleCache *pQVar1;
  uint degree;
  reference pvVar2;
  QuadRule *pQVar3;
  array<unsigned_int,_4UL> *this_00;
  stringstream ss_4;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  uint local_6c;
  value_type_conflict1 local_68;
  value_type_conflict1 local_64;
  value_type_conflict1 local_60;
  value_type_conflict1 local_5c;
  iterator local_58;
  undefined8 local_50;
  RefEl local_47;
  RefEl local_46;
  RefEl local_45;
  RefEl local_31;
  QuadRuleCache *local_30;
  QuadRuleCache *qr_cache_local;
  FeHierarchicQuad<double> *pFStack_20;
  uint interior_degree_local;
  FeHierarchicQuad<double> *this_local;
  array<unsigned_int,_4UL> edge_degrees_local;
  
  edge_degrees_local._M_elems._0_8_ = edge_degrees._M_elems._8_8_;
  this_local = edge_degrees._M_elems._0_8_;
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  local_30 = qr_cache;
  qr_cache_local._4_4_ = interior_degree;
  pFStack_20 = this;
  ScalarReferenceFiniteElement<double>::ScalarReferenceFiniteElement
            (&this->super_ScalarReferenceFiniteElement<double>);
  pQVar1 = local_30;
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__FeHierarchicQuad_00cadcb0;
  this->interior_degree_ = qr_cache_local._4_4_;
  *(FeHierarchicQuad<double> **)(this->edge_degrees_)._M_elems = this_local;
  *(undefined8 *)((this->edge_degrees_)._M_elems + 2) = edge_degrees_local._M_elems._0_8_;
  local_31 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
  pQVar3 = quad::QuadRuleCache::Get(pQVar1,local_31,*pvVar2 * 2 - 2);
  pQVar1 = local_30;
  (this->qr_dual_edge_)._M_elems[0] = pQVar3;
  local_45 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,1);
  pQVar3 = quad::QuadRuleCache::Get(pQVar1,local_45,*pvVar2 * 2 - 2);
  pQVar1 = local_30;
  (this->qr_dual_edge_)._M_elems[1] = pQVar3;
  local_46 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,2);
  pQVar3 = quad::QuadRuleCache::Get(pQVar1,local_46,*pvVar2 * 2 - 2);
  pQVar1 = local_30;
  (this->qr_dual_edge_)._M_elems[2] = pQVar3;
  local_47 = lf::base::RefEl::kSegment();
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,3);
  pQVar3 = quad::QuadRuleCache::Get(pQVar1,local_47,*pvVar2 * 2 - 2);
  (this->qr_dual_edge_)._M_elems[3] = pQVar3;
  local_6c = this->interior_degree_;
  this_00 = &this->edge_degrees_;
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](this_00,0);
  local_68 = *pvVar2;
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](this_00,1);
  local_64 = *pvVar2;
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](this_00,2);
  local_60 = *pvVar2;
  pvVar2 = std::array<unsigned_int,_4UL>::operator[](this_00,3);
  local_5c = *pvVar2;
  local_58 = &local_6c;
  local_50 = 5;
  __l._M_len = 5;
  __l._M_array = local_58;
  degree = std::max<unsigned_int>(__l);
  FeHierarchicSegment<double>::FeHierarchicSegment(&this->fe1d_,degree,local_30);
  (this->rel_orient_)._M_ptr = rel_orient._M_ptr;
  (this->rel_orient_)._M_extent._M_extent_value = rel_orient._M_extent._M_extent_value;
  std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
  std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,1);
  std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,2);
  std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,3);
  return;
}

Assistant:

FeHierarchicQuad(unsigned interior_degree,
                   std::array<unsigned, 4> edge_degrees,
                   const quad::QuadRuleCache &qr_cache,
                   std::span<const lf::mesh::Orientation> rel_orient)
      : ScalarReferenceFiniteElement<SCALAR>(),
        interior_degree_(interior_degree),
        edge_degrees_(edge_degrees),
        qr_dual_edge_({&qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[0] - 1)),
                       &qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[1] - 1)),
                       &qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[2] - 1)),
                       &qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[3] - 1))}),
        rel_orient_(rel_orient),
        fe1d_(std::max({interior_degree_, edge_degrees_[0], edge_degrees_[1],
                        edge_degrees_[2], edge_degrees_[3]}),
              qr_cache) {
    LF_ASSERT_MSG(interior_degree_ >= 0, "illegal interior degree.");
    LF_ASSERT_MSG(edge_degrees_[0] >= 0, "illegal degree for edge 0");
    LF_ASSERT_MSG(edge_degrees_[1] >= 0, "illegal degree for edge 1");
    LF_ASSERT_MSG(edge_degrees_[2] >= 0, "illegal degree for edge 2");
    LF_ASSERT_MSG(edge_degrees_[3] >= 0, "illegal degree for edge 3");
  }